

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial2.hpp
# Opt level: O2

void RadianceTexture(void)

{
  double dVar1;
  double dVar2;
  double dVar3;
  clock_t cVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int x;
  int iVar8;
  int y;
  int iVar9;
  Vector v;
  Vector radiance;
  Random local_80;
  Ray ray;
  
  for (iVar9 = 0; iVar6 = height, iVar9 < height; iVar9 = iVar9 + 1) {
    cVar4 = clock();
    uVar5 = (uint)((int)cVar4 * iVar6 + iVar9) % 0x7fffffff;
    local_80._gen._M_x = (unsigned_long)(uVar5 + (uVar5 == 0));
    local_80._dist._M_param._M_a = 0.0;
    local_80._dist._M_param._M_b = 1.0;
    iVar6 = -1;
    for (iVar8 = 0; iVar8 < width; iVar8 = iVar8 + 1) {
      iVar7 = (width + iVar6) * height + iVar9;
      dVar1 = Random::operator()(&local_80);
      dVar2 = Random::operator()(&local_80);
      dVar3 = (double)(((float)iVar8 + (float)dVar1) / (float)width) + -0.5;
      dVar1 = (double)(((float)dVar2 + (float)iVar9) / (float)height) + -0.5;
      v.x = cam.d.x + dVar1 * cy.x + dVar3 * cx.x;
      v.y = cam.d.y + dVar1 * cy.y + dVar3 * cx.y;
      v.z = cy.z * dVar1 + cx.z * dVar3 + cam.d.z;
      Vector::Normalize(&ray.o,&v);
      ray.o.z = cam.o.z;
      ray.o.x = cam.o.x;
      ray.o.y = cam.o.y;
      ray.d.z = v.z;
      ray.d.x = v.x;
      ray.d.y = v.y;
      Radiance(&radiance,&spheres,&ray,&local_80,0,1);
      bcg_img[iVar7] =
           (float)(((radiance.x + radiance.y + radiance.z) / 3.0 +
                   (double)((float)nPasses * bcg_img[iVar7])) / (double)(nPasses + 1));
      iVar6 = iVar6 + -1;
    }
  }
  nPasses = nPasses + 1;
  return;
}

Assistant:

void RadianceTexture() {

   // Loop over the rows and columns of the image and evaluate radiance and
   // covariance per pixel using Monte-Carlo.
   #pragma omp parallel for schedule(dynamic, 1)
   for (int y=0; y<height; y++){
      Random rng(y + height*clock());

      for (int x=0; x<width; x++) {
         int i=(width-x-1)*height+y;

         // Create the RNG and get the sub-pixel sample
         float dx = rng();
         float dy = rng();

         // Generate the pixel direction
         Vector d = cx*((dx + x)/float(width)  - .5) +
                    cy*((dy + y)/float(height) - .5) + cam.d;
         d.Normalize();

         Ray ray(cam.o, d);
         Vector radiance = Radiance(spheres, ray, rng, 0, 1);

         bcg_img[i] = (float(nPasses)*bcg_img[i] + Vector::Dot(radiance, Vector(1,1,1))/3.0f) / float(nPasses+1);
      }
   }

   ++nPasses;
}